

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O0

_Bool do_zzi_sat(DisasContext_conflict1 *s,arg_rri_esz *a,_Bool u,_Bool d)

{
  TCGContext_conflict1 *tcg_ctx_00;
  _Bool _Var1;
  uint32_t uVar2;
  TCGv_i64 val_00;
  TCGv_i64 val;
  TCGContext_conflict1 *tcg_ctx;
  _Bool d_local;
  _Bool u_local;
  arg_rri_esz *a_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  if ((a->esz == 0) && (uVar2 = extract32(s->insn,0xd,1), uVar2 != 0)) {
    s_local._7_1_ = false;
  }
  else {
    _Var1 = sve_access_check_aarch64(s);
    if (_Var1) {
      val_00 = tcg_const_i64_aarch64(tcg_ctx_00,(long)a->imm);
      do_sat_addsub_vec(s,a->esz,a->rd,a->rn,val_00,u,d);
      tcg_temp_free_i64(tcg_ctx_00,val_00);
    }
    s_local._7_1_ = true;
  }
  return s_local._7_1_;
}

Assistant:

static bool do_zzi_sat(DisasContext *s, arg_rri_esz *a, bool u, bool d)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (a->esz == 0 && extract32(s->insn, 13, 1)) {
        return false;
    }
    if (sve_access_check(s)) {
        TCGv_i64 val = tcg_const_i64(tcg_ctx, a->imm);
        do_sat_addsub_vec(s, a->esz, a->rd, a->rn, val, u, d);
        tcg_temp_free_i64(tcg_ctx, val);
    }
    return true;
}